

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

qpTestLog * qpTestLog_createFileLog(char *fileName,deUint32 flags)

{
  FILE *pFVar1;
  qpXmlWriter *pqVar2;
  deMutex dVar3;
  qpTestLog *log;
  deUint32 flags_local;
  char *fileName_local;
  
  fileName_local = (char *)deCalloc(0x28);
  if ((qpTestLog *)fileName_local == (qpTestLog *)0x0) {
    fileName_local = (char *)0x0;
  }
  else {
    qpPrintf("Writing test log into %s\n",fileName);
    pFVar1 = fopen(fileName,"wb");
    ((qpTestLog *)fileName_local)->outputFile = (FILE *)pFVar1;
    if (((qpTestLog *)fileName_local)->outputFile == (FILE *)0x0) {
      qpPrintf("ERROR: Unable to open test log output file \'%s\'.\n",fileName);
      qpTestLog_destroy((qpTestLog *)fileName_local);
      fileName_local = (char *)0x0;
    }
    else {
      ((qpTestLog *)fileName_local)->flags = flags;
      pqVar2 = qpXmlWriter_createFileWriter
                         (((qpTestLog *)fileName_local)->outputFile,0,
                          (uint)(((flags & 4) != 0 ^ 0xffU) & 1));
      ((qpTestLog *)fileName_local)->writer = pqVar2;
      dVar3 = deMutex_create((deMutexAttributes *)0x0);
      ((qpTestLog *)fileName_local)->lock = dVar3;
      ((qpTestLog *)fileName_local)->isSessionOpen = 0;
      ((qpTestLog *)fileName_local)->isCaseOpen = 0;
      if (((qpTestLog *)fileName_local)->writer == (qpXmlWriter *)0x0) {
        qpPrintf("ERROR: Unable to create output XML writer to file \'%s\'.\n",fileName);
        qpTestLog_destroy((qpTestLog *)fileName_local);
        fileName_local = (char *)0x0;
      }
      else if (((qpTestLog *)fileName_local)->lock == 0) {
        qpPrintf("ERROR: Unable to create mutex.\n");
        qpTestLog_destroy((qpTestLog *)fileName_local);
        fileName_local = (char *)0x0;
      }
      else {
        beginSession((qpTestLog *)fileName_local);
      }
    }
  }
  return (qpTestLog *)fileName_local;
}

Assistant:

qpTestLog* qpTestLog_createFileLog (const char* fileName, deUint32 flags)
{
	qpTestLog* log = (qpTestLog*)deCalloc(sizeof(qpTestLog));
	if (!log)
		return DE_NULL;

	DE_ASSERT(fileName && fileName[0]); /* must have filename. */

#if defined(DE_DEBUG)
	ContainerStack_reset(&log->containerStack);
#endif

	qpPrintf("Writing test log into %s\n", fileName);

	/* Create output file. */
	log->outputFile = fopen(fileName, "wb");
	if (!log->outputFile)
	{
		qpPrintf("ERROR: Unable to open test log output file '%s'.\n", fileName);
		qpTestLog_destroy(log);
		return DE_NULL;
	}

	log->flags			= flags;
	log->writer			= qpXmlWriter_createFileWriter(log->outputFile, 0, !(flags & QP_TEST_LOG_NO_FLUSH));
	log->lock			= deMutex_create(DE_NULL);
	log->isSessionOpen	= DE_FALSE;
	log->isCaseOpen		= DE_FALSE;

	if (!log->writer)
	{
		qpPrintf("ERROR: Unable to create output XML writer to file '%s'.\n", fileName);
		qpTestLog_destroy(log);
		return DE_NULL;
	}

	if (!log->lock)
	{
		qpPrintf("ERROR: Unable to create mutex.\n");
		qpTestLog_destroy(log);
		return DE_NULL;
	}

	beginSession(log);

	return log;
}